

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::Load::~Load(Load *this)

{
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Load_0012a428;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Load_0012a448;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->addr).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Definition::~Definition(&this->super_Definition);
  return;
}

Assistant:

Load(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> addr)
      : IRInst(InstType::Load), Definition(std::move(dest)),
        addr(std::move(addr)) {}